

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O2

bool sqlcheck::IsDDLStatement(string *sql_statement)

{
  long lVar1;
  bool bVar2;
  string alter_table_template;
  string create_table_template;
  allocator local_59;
  allocator local_58 [32];
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,"create table",local_58);
  lVar1 = std::__cxx11::string::find((string *)sql_statement,(ulong)local_38);
  bVar2 = true;
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)local_58,"alter table",&local_59);
    lVar1 = std::__cxx11::string::find((string *)sql_statement,(ulong)local_58);
    bVar2 = lVar1 != -1;
    std::__cxx11::string::~string((string *)local_58);
  }
  std::__cxx11::string::~string(local_38);
  return bVar2;
}

Assistant:

bool IsDDLStatement(const std::string& sql_statement){
  std::string create_table_template = "create table";
  std::size_t found = sql_statement.find(create_table_template);
  if (found != std::string::npos) {
    return true;
  }

  std::string alter_table_template = "alter table";
  found = sql_statement.find(alter_table_template);
  if (found != std::string::npos) {
    return true;
  }

  return false;
}